

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestMap_Test::TestBody
          (DescriptorPoolTypeResolverTest_TestMap_Test *this)

{
  RepeatedPtrField<google::protobuf::Option> *this_00;
  TypeResolver *pTVar1;
  void *pvVar2;
  bool bVar3;
  Descriptor *pDVar4;
  void **ppvVar5;
  const_iterator cVar6;
  undefined8 *puVar7;
  char *in_RCX;
  char *pcVar8;
  _anonymous_namespace_ *this_01;
  undefined1 *this_02;
  char *in_R9;
  string_view name;
  string_view full_name;
  string_view full_name_00;
  string_view full_name_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view type_url;
  string_view name_00;
  int in_stack_ffffffffffffff08;
  Status local_f0;
  AssertHelper local_e8;
  string local_e0;
  AssertionResult gtest_ar_;
  Type type;
  char *expected_predicate_value;
  
  Type::Type(&type);
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  pDVar4 = proto2_unittest::TestMap::GetDescriptor();
  pcVar8 = (pDVar4->all_names_).payload_;
  this_01 = (_anonymous_namespace_ *)(ulong)*(ushort *)(pcVar8 + 2);
  full_name._M_len = pcVar8 + ~(ulong)this_01;
  full_name._M_str = in_RCX;
  util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_(&local_e0,this_01,full_name);
  (*pTVar1->_vptr_TypeResolver[2])(&local_f0,pTVar1,&local_e0,&type);
  gtest_ar_.success_ = (long *)local_f0.rep_ == (long *)0x1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  absl::lts_20250127::Status::~Status(&local_f0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType(GetTypeUrl<proto2_unittest::TestMap>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x144,local_e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((long *)local_f0.rep_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.rep_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pcVar8 = &DAT_0000000f;
    expected_predicate_value = (char *)0x1;
    name_00._M_str = (char *)0x1;
    name_00._M_len = (size_t)"map_int32_int32";
    gtest_ar_.success_ =
         HasField((anon_unknown_0 *)&type,(Type *)0x3,0xb,Field_Kind_TYPE_SFIXED32,name_00,
                  in_stack_ffffffffffffff08);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e0,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE, \"map_int32_int32\", 1)"
                 ,"false","true",expected_predicate_value);
      pcVar8 = (char *)0x146;
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x146,local_e0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&local_e0);
      if ((long *)local_f0.rep_ != (long *)0x0) {
        (**(code **)(*(long *)local_f0.rep_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    full_name_00._M_str = pcVar8;
    full_name_00._M_len = (size_t)"proto2_unittest.TestMap.MapInt32Int32Entry";
    util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
              (&local_e0,(_anonymous_namespace_ *)&DAT_0000002a,full_name_00);
    name._M_str = "map_int32_int32";
    name._M_len = 0xf;
    type_url._M_str = local_e0._M_dataplus._M_p;
    type_url._M_len = local_e0._M_string_length;
    gtest_ar_.success_ = CheckFieldTypeUrl(&type,name,type_url);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::__cxx11::string::~string((string *)&local_e0);
    pcVar8 = (char *)local_e0._M_string_length;
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e0,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "CheckFieldTypeUrl( type, \"map_int32_int32\", GetTypeUrl(\"proto2_unittest.TestMap.MapInt32Int32Entry\"))"
                 ,"false","true",expected_predicate_value);
      pcVar8 = (char *)0x149;
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x149,local_e0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&local_e0);
      if ((long *)local_f0.rep_ != (long *)0x0) {
        (**(code **)(*(long *)local_f0.rep_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
             super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
             .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
    full_name_01._M_str = pcVar8;
    full_name_01._M_len = (size_t)"proto2_unittest.TestMap.MapInt32Int32Entry";
    util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
              (&local_e0,(_anonymous_namespace_ *)&DAT_0000002a,full_name_01);
    (*pTVar1->_vptr_TypeResolver[2])(&local_f0,pTVar1,&local_e0,&type);
    gtest_ar_.success_ = (long *)local_f0.rep_ == (long *)0x1;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    absl::lts_20250127::Status::~Status(&local_f0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e0,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "resolver_ ->ResolveMessageType( GetTypeUrl(\"proto2_unittest.TestMap.MapInt32Int32Entry\"), &type) .ok()"
                 ,"false","true",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x14f,local_e0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      this_00 = &type.field_0._impl_.options_;
      ppvVar5 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
      cVar6 = RepeatedPtrField<google::protobuf::Option>::end(this_00);
      for (; ppvVar5 != cVar6.it_; ppvVar5 = ppvVar5 + 1) {
        pvVar2 = *ppvVar5;
        puVar7 = (undefined8 *)(*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffffc);
        __y._M_str = "map_entry";
        __y._M_len = 9;
        __x._M_str = (char *)*puVar7;
        __x._M_len = puVar7[1];
        bVar3 = std::operator==(__x,__y);
        if (bVar3) {
          BoolValue::BoolValue((BoolValue *)&local_e0);
          this_02 = *(undefined1 **)((long)pvVar2 + 0x20);
          if ((Any *)this_02 == (Any *)0x0) {
            this_02 = _Any_default_instance_;
          }
          bVar3 = Any::UnpackTo((Any *)this_02,(Message *)&local_e0);
          if ((bVar3) && (local_e0.field_2._M_local_buf[8] != '\0')) {
            BoolValue::~BoolValue((BoolValue *)&local_e0);
            gtest_ar_.success_ = true;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            goto LAB_0095a82d;
          }
          BoolValue::~BoolValue((BoolValue *)&local_e0);
        }
      }
      gtest_ar_.success_ = false;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e0,(internal *)&gtest_ar_,
                 (AssertionResult *)"HasBoolOption(type.options(), \"map_entry\", true)","false",
                 "true",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x150,local_e0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((long *)local_f0.rep_ != (long *)0x0) {
      (**(code **)(*(long *)local_f0.rep_ + 8))();
    }
  }
LAB_0095a82d:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  Type::~Type(&type);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestMap) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(GetTypeUrl<proto2_unittest::TestMap>(), &type)
          .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE,
                       "map_int32_int32", 1));
  EXPECT_TRUE(CheckFieldTypeUrl(
      type, "map_int32_int32",
      GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry")));

  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry"), &type)
          .ok());
  EXPECT_TRUE(HasBoolOption(type.options(), "map_entry", true));
}